

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O2

int flatcc_verify_struct_as_root(void *buf,size_t bufsiz,char *fid,size_t size,uint16_t align)

{
  int iVar1;
  
  iVar1 = flatcc_verify_buffer_header(buf,bufsiz,fid);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = verify_struct((flatbuffers_uoffset_t)bufsiz,0,*buf,(flatbuffers_uoffset_t)size,align);
  return iVar1;
}

Assistant:

int flatcc_verify_struct_as_root(const void *buf, size_t bufsiz, const char *fid, size_t size, uint16_t align)
{
    check_result(flatcc_verify_buffer_header(buf, bufsiz, fid));
    return verify_struct((uoffset_t)bufsiz, 0, read_uoffset(buf, 0), (uoffset_t)size, align);
}